

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O2

void __thiscall
bloaty::dwarf::ReadRangeList
          (dwarf *this,CU *cu,uint64_t low_pc,string_view name,RangeSink *sink,string_view *data)

{
  dwarf dVar1;
  uint64_t uVar2;
  CU *pCVar3;
  string name_str;
  allocator<char> local_61;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = (char *)name._M_len;
  local_40._M_len = low_pc;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_60,&local_40,&local_61);
  dVar1 = this[0x2b];
  while( true ) {
    pCVar3 = cu;
    uVar2 = CompilationUnitSizes::ReadAddress
                      ((CompilationUnitSizes *)(this + 0x28),(string_view *)sink);
    cu = (CU *)CompilationUnitSizes::ReadAddress
                         ((CompilationUnitSizes *)(this + 0x28),(string_view *)sink);
    if (cu == (CU *)0x0 && uVar2 == 0) break;
    if (uVar2 != (-(ulong)(byte)dVar1 | 0xffffffff)) {
      RangeSink::AddVMRangeIgnoreDuplicate
                ((RangeSink *)name._M_str,"dwarf_rangelist",(long)&pCVar3->dwarf_ + uVar2,
                 (long)cu - uVar2,&local_60);
      cu = pCVar3;
    }
  }
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void ReadRangeList(const CU& cu, uint64_t low_pc, string_view name,
                   RangeSink* sink, string_view* data) {
  std::string name_str(name);
  uint64_t max_address = cu.unit_sizes().MaxAddress();
  while (true) {
    uint64_t start, end;
    start = cu.unit_sizes().ReadAddress(data);
    end = cu.unit_sizes().ReadAddress(data);
    if (start == 0 && end == 0) {
      return;
    } else if (start == max_address) {
      low_pc = end;
    } else {
      uint64_t size = end - start;
      sink->AddVMRangeIgnoreDuplicate("dwarf_rangelist", low_pc + start, size,
                                      name_str);
    }
  }
}